

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

void __thiscall
FileTokenizer::createToken(FileTokenizer *this,TokenType type,size_t length,int64_t value)

{
  size_t sVar1;
  int64_t local_48;
  long *local_40 [2];
  long local_30 [2];
  
  (this->token).type = type;
  sVar1 = this->linePos;
  (this->token).line = this->lineNumber;
  (this->token).column = sVar1 + 1;
  std::__cxx11::string::substr((ulong)local_40,(ulong)&this->currentLine);
  local_48 = value;
  std::variant<std::monostate,long,double,StringLiteral,Identifier>::operator=
            ((variant<std::monostate,long,double,StringLiteral,Identifier> *)&(this->token).value,
             &local_48);
  std::__cxx11::string::operator=((string *)&(this->token).originalText,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  this->linePos = this->linePos + length;
  return;
}

Assistant:

void FileTokenizer::createToken(TokenType type, size_t length, int64_t value)
{
	token.type = type;
	token.line = lineNumber;
	token.column = linePos+1;
	token.setValue(value, currentLine.substr(linePos, length));

	linePos += length;
}